

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::dampClusters(btSoftBody *this)

{
  float fVar1;
  undefined8 uVar2;
  Cluster **ppCVar3;
  Cluster *pCVar4;
  Node **ppNVar5;
  Node *pNVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  lVar7 = (long)(this->m_clusters).m_size;
  if (0 < lVar7) {
    ppCVar3 = (this->m_clusters).m_data;
    lVar8 = 0;
    do {
      pCVar4 = ppCVar3[lVar8];
      if ((0.0 < pCVar4->m_ndamping) && (lVar9 = (long)(pCVar4->m_nodes).m_size, 0 < lVar9)) {
        ppNVar5 = (pCVar4->m_nodes).m_data;
        lVar10 = 0;
        do {
          pNVar6 = ppNVar5[lVar10];
          if (0.0 < pNVar6->m_im) {
            fVar11 = (pNVar6->m_q).m_floats[1] - (pCVar4->m_com).m_floats[1];
            fVar1 = (pCVar4->m_av).m_floats[0];
            fVar12 = (pNVar6->m_q).m_floats[2] - (pCVar4->m_com).m_floats[2];
            fVar14 = (pNVar6->m_q).m_floats[0] - (pCVar4->m_com).m_floats[0];
            uVar2 = *(undefined8 *)((pCVar4->m_av).m_floats + 1);
            fVar15 = (float)uVar2;
            fVar16 = (float)((ulong)uVar2 >> 0x20);
            uVar2 = *(undefined8 *)(pCVar4->m_lv).m_floats;
            fVar13 = (float)uVar2 + (fVar15 * fVar12 - fVar11 * fVar16);
            fVar12 = (float)((ulong)uVar2 >> 0x20) + (fVar16 * fVar14 - fVar12 * fVar1);
            fVar11 = (fVar11 * fVar1 - fVar14 * fVar15) + (pCVar4->m_lv).m_floats[2];
            uVar2 = *(undefined8 *)(pNVar6->m_v).m_floats;
            fVar1 = (pNVar6->m_v).m_floats[2];
            fVar14 = (float)uVar2;
            fVar15 = (float)((ulong)uVar2 >> 0x20);
            if (fVar11 * fVar11 + fVar13 * fVar13 + fVar12 * fVar12 <=
                fVar1 * fVar1 + fVar14 * fVar14 + fVar15 * fVar15) {
              fVar16 = pCVar4->m_ndamping;
              *(ulong *)(pNVar6->m_v).m_floats =
                   CONCAT44(fVar16 * (fVar12 - fVar15) + fVar15,fVar16 * (fVar13 - fVar14) + fVar14)
              ;
              (pNVar6->m_v).m_floats[2] = (fVar11 - fVar1) * fVar16 + fVar1;
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar9 != lVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar7);
  }
  return;
}

Assistant:

void					btSoftBody::dampClusters()
{
	int i;

	for(i=0;i<m_clusters.size();++i)
	{
		Cluster&	c=*m_clusters[i];	
		if(c.m_ndamping>0)
		{
			for(int j=0;j<c.m_nodes.size();++j)
			{
				Node&			n=*c.m_nodes[j];
				if(n.m_im>0)
				{
					const btVector3	vx=c.m_lv+btCross(c.m_av,c.m_nodes[j]->m_q-c.m_com);
					if(vx.length2()<=n.m_v.length2())
						{
						n.m_v	+=	c.m_ndamping*(vx-n.m_v);
						}
				}
			}
		}
	}
}